

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::update
          (HighsSparseMatrix *this,HighsInt var_in,HighsInt var_out,HighsSparseMatrix *matrix)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  iVar10 = this->num_col_;
  if (var_in < iVar10) {
    piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = (long)piVar4[var_in]; lVar12 < piVar4[(long)var_in + 1]; lVar12 = lVar12 + 1) {
      iVar10 = piVar5[lVar12];
      iVar2 = piVar6[iVar10];
      iVar3 = piVar7[iVar10];
      piVar7[iVar10] = iVar3 + -1;
      lVar14 = (long)iVar2 << 2;
      do {
        lVar13 = lVar14;
        lVar14 = lVar13 + 4;
      } while (*(int *)((long)piVar8 + lVar13) != var_in);
      *(int *)((long)piVar8 + lVar13) = piVar8[(long)iVar3 + -1];
      piVar8[(long)iVar3 + -1] = var_in;
      dVar1 = *(double *)((long)pdVar9 + lVar14 * 2 + -8);
      *(double *)((long)pdVar9 + lVar14 * 2 + -8) = pdVar9[(long)iVar3 + -1];
      pdVar9[(long)iVar3 + -1] = dVar1;
    }
    iVar10 = this->num_col_;
  }
  if (var_out < iVar10) {
    piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = (long)piVar4[var_out]; lVar12 < piVar4[(long)var_out + 1]; lVar12 = lVar12 + 1) {
      iVar10 = piVar5[lVar12];
      iVar2 = piVar6[iVar10];
      lVar13 = (long)iVar2;
      piVar6[iVar10] = iVar2 + 1;
      lVar14 = lVar13 * 4;
      do {
        lVar11 = lVar14;
        lVar14 = lVar11 + 4;
      } while (*(int *)((long)piVar7 + lVar11) != var_out);
      *(int *)((long)piVar7 + lVar11) = piVar7[lVar13];
      piVar7[lVar13] = var_out;
      dVar1 = *(double *)((long)pdVar9 + lVar14 * 2 + -8);
      *(double *)((long)pdVar9 + lVar14 * 2 + -8) = pdVar9[lVar13];
      pdVar9[lVar13] = dVar1;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::update(const HighsInt var_in, const HighsInt var_out,
                               const HighsSparseMatrix& matrix) {
  assert(matrix.format_ == MatrixFormat::kColwise);
  assert(this->format_ == MatrixFormat::kRowwisePartitioned);
  if (var_in < this->num_col_) {
    for (HighsInt iEl = matrix.start_[var_in]; iEl < matrix.start_[var_in + 1];
         iEl++) {
      HighsInt iRow = matrix.index_[iEl];
      HighsInt iFind = this->start_[iRow];
      HighsInt iSwap = --this->p_end_[iRow];
      while (this->index_[iFind] != var_in) iFind++;
      // todo @ Julian : this assert can fail
      assert(iFind >= 0 && iFind < int(this->index_.size()));
      assert(iSwap >= 0 && iSwap < int(this->value_.size()));
      swap(this->index_[iFind], this->index_[iSwap]);
      swap(this->value_[iFind], this->value_[iSwap]);
    }
  }

  if (var_out < this->num_col_) {
    for (HighsInt iEl = matrix.start_[var_out];
         iEl < matrix.start_[var_out + 1]; iEl++) {
      HighsInt iRow = matrix.index_[iEl];
      HighsInt iFind = this->p_end_[iRow];
      HighsInt iSwap = this->p_end_[iRow]++;
      while (this->index_[iFind] != var_out) iFind++;
      swap(this->index_[iFind], this->index_[iSwap]);
      swap(this->value_[iFind], this->value_[iSwap]);
    }
  }
}